

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O3

void tio_set_html_expansion(uint html_char_val,char *expansion,size_t expansion_len)

{
  void *__dest;
  ulong uVar1;
  
  uVar1 = 0xffffffffffffffe8;
  do {
    if (*(uint *)((long)&amp_tbl[1].html_cval + uVar1) == html_char_val) {
      __dest = malloc(expansion_len + 1);
      *(void **)((long)&amp_tbl[1].expan + uVar1) = __dest;
      memcpy(__dest,expansion,expansion_len);
      *(undefined1 *)((long)__dest + expansion_len) = 0;
      return;
    }
    uVar1 = uVar1 + 0x18;
  } while (uVar1 < 0x1c98);
  return;
}

Assistant:

void tio_set_html_expansion(unsigned int html_char_val,
                            const char *expansion, size_t expansion_len)
{
    struct amp_tbl_t *p;

    /* find the character value */
    for (p = amp_tbl ;
         p < amp_tbl + sizeof(amp_tbl)/sizeof(amp_tbl[0]) ; ++p)
    {
        /* if this is the one, store it */
        if (p->html_cval == html_char_val)
        {
            /* allocate space for it */
            p->expan = (char *)osmalloc(expansion_len + 1);

            /* save it */
            memcpy(p->expan, expansion, expansion_len);
            p->expan[expansion_len] = '\0';

            /* no need to look any further */
            return;
        }
    }
}